

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noisy_laser_tag.cpp
# Opt level: O2

double __thiscall despot::NoisyLaserTag::LaserRange(NoisyLaserTag *this,State *state,int dir)

{
  Floor *this_00;
  int iVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  undefined8 local_50;
  Coord coord;
  Coord rob;
  Coord opp;
  
  this_00 = &(this->super_BaseTag).floor_;
  iVar4 = (int)this_00;
  _rob = despot::Floor::GetCell(iVar4);
  _opp = despot::Floor::GetCell(iVar4);
  iVar4 = 1;
  while( true ) {
    local_50 = despot::Coord::operator*((Coord *)(&Compass::DIRECTIONS + dir),iVar4);
    _coord = despot::operator+(&rob,(Coord *)&local_50);
    iVar3 = Floor::GetIndex(this_00,&coord);
    if (iVar3 == -1) break;
    cVar2 = despot::operator==(&coord,&opp);
    if (cVar2 != '\0') break;
    iVar4 = iVar4 + 1;
  }
  iVar3 = *(int *)(&Compass::DIRECTIONS + dir);
  iVar1 = *(int *)((long)&Compass::DIRECTIONS + (long)dir * 8 + 4);
  return SQRT((double)(iVar1 * iVar1 + iVar3 * iVar3)) * (double)iVar4;
}

Assistant:

double NoisyLaserTag::LaserRange(const State& state, int dir) const {
	Coord rob = floor_.GetCell(rob_[state.state_id]), opp = floor_.GetCell(
		opp_[state.state_id]);
	int d = 1;
	while (true) {
		Coord coord = rob + Compass::DIRECTIONS[dir] * d;
		if (floor_.GetIndex(coord) == -1 || coord == opp)
			break;
		d++;
	}
	int x = Compass::DIRECTIONS[dir].x, y = Compass::DIRECTIONS[dir].y;

	return d * sqrt(x * x + y * y);
}